

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

int __thiscall c4::yml::Tree::_copy(Tree *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  size_t sVar2;
  code *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  bool bVar11;
  int iVar12;
  NodeData *__dest;
  char *pcVar13;
  long lVar14;
  substr next_arena;
  char msg [33];
  char local_e8 [40];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  char *pcStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  if (this->m_buf != (NodeData *)0x0) {
    builtin_strncpy(local_e8 + 0x10,"_buf == nullptr)",0x11);
    builtin_strncpy(local_e8,"check failed: (m",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar3 = (code *)swi(3);
        iVar12 = (*pcVar3)();
        return iVar12;
      }
    }
    local_48 = 0;
    uStack_40 = 0x62e0;
    local_38 = 0;
    pcStack_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x65;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x62e0) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x62e0) << 0x40,8);
    LVar7.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar7.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_e8,0x21,LVar7,(this->m_callbacks).m_user_data);
  }
  if ((this->m_arena).str != (char *)0x0) {
    builtin_strncpy(local_e8,"check failed: (m_arena.str == nullptr)",0x27);
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar3 = (code *)swi(3);
        iVar12 = (*pcVar3)();
        return iVar12;
      }
    }
    local_70 = 0;
    uStack_68 = 0x62e1;
    local_60 = 0;
    pcStack_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_50 = 0x65;
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x62e1) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x62e1) << 0x40,8);
    LVar8.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar8.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_e8,0x27,LVar8,(this->m_callbacks).m_user_data);
  }
  if ((this->m_arena).len != 0) {
    builtin_strncpy(local_e8 + 0x10,"_arena.len == 0)",0x11);
    builtin_strncpy(local_e8,"check failed: (m",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar3 = (code *)swi(3);
        iVar12 = (*pcVar3)();
        return iVar12;
      }
    }
    local_98 = 0;
    uStack_90 = 0x62e2;
    local_88 = 0;
    pcStack_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_78 = 0x65;
    LVar9.super_LineCol.col = 0;
    LVar9.super_LineCol.offset = SUB168(ZEXT816(0x62e2) << 0x40,0);
    LVar9.super_LineCol.line = SUB168(ZEXT816(0x62e2) << 0x40,8);
    LVar9.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar9.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_e8,0x21,LVar9,(this->m_callbacks).m_user_data);
  }
  __dest = (NodeData *)
           (*(this->m_callbacks).m_allocate)
                     (*(long *)(dst + 8) * 0x90,*(void **)dst,(this->m_callbacks).m_user_data);
  this->m_buf = __dest;
  memcpy(__dest,*(void **)dst,*(long *)(dst + 8) * 0x90);
  sVar2 = *(size_t *)(dst + 0x10);
  this->m_cap = *(size_t *)(dst + 8);
  this->m_size = sVar2;
  sVar2 = *(size_t *)(dst + 0x20);
  this->m_free_head = *(size_t *)(dst + 0x18);
  this->m_free_tail = sVar2;
  this->m_arena_pos = *(size_t *)(dst + 0x38);
  sVar2 = *(size_t *)(dst + 0x30);
  (this->m_arena).str = *(char **)(dst + 0x28);
  (this->m_arena).len = sVar2;
  if (*(long *)(dst + 0x28) != 0) {
    if (*(long *)(dst + 0x30) == 0) {
      builtin_strncpy(local_e8,"check failed: (that.m_arena.len > 0)",0x25);
      if ((s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar3 = (code *)swi(3);
          iVar12 = (*pcVar3)();
          return iVar12;
        }
      }
      local_c0 = 0;
      uStack_b8 = 0x62ed;
      local_b0 = 0;
      pcStack_a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_a0 = 0x65;
      LVar10.super_LineCol.col = 0;
      LVar10.super_LineCol.offset = SUB168(ZEXT816(0x62ed) << 0x40,0);
      LVar10.super_LineCol.line = SUB168(ZEXT816(0x62ed) << 0x40,8);
      LVar10.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar10.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_e8,0x25,LVar10,(this->m_callbacks).m_user_data);
    }
    pcVar13 = (char *)(*(this->m_callbacks).m_allocate)
                                (*(size_t *)(dst + 0x30),*(void **)(dst + 0x28),
                                 (this->m_callbacks).m_user_data);
    sVar2 = *(size_t *)(dst + 0x30);
    next_arena.len = sVar2;
    next_arena.str = pcVar13;
    _relocate(this,next_arena);
    (this->m_arena).str = pcVar13;
    (this->m_arena).len = sVar2;
  }
  lVar14 = 0x60;
  do {
    *(undefined8 *)((long)this->m_tag_directives + lVar14 + -0x40) =
         *(undefined8 *)(dst + lVar14 + 0x20);
    uVar4 = *(undefined8 *)(dst + lVar14);
    uVar5 = *(undefined8 *)(dst + lVar14 + 8);
    uVar6 = *(undefined8 *)(dst + lVar14 + 0x10 + 8);
    puVar1 = (undefined8 *)((long)(this->m_tag_directives + -2) + lVar14);
    *puVar1 = *(undefined8 *)(dst + lVar14 + 0x10);
    puVar1[1] = uVar6;
    puVar1 = (undefined8 *)((long)this->m_tag_directives + lVar14 + -0x60);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    lVar14 = lVar14 + 0x28;
  } while (lVar14 != 0x100);
  return 0x100;
}

Assistant:

void Tree::_copy(Tree const& that)
{
    _RYML_CB_ASSERT(m_callbacks, m_buf == nullptr);
    _RYML_CB_ASSERT(m_callbacks, m_arena.str == nullptr);
    _RYML_CB_ASSERT(m_callbacks, m_arena.len == 0);
    m_buf = _RYML_CB_ALLOC_HINT(m_callbacks, NodeData, that.m_cap, that.m_buf);
    memcpy(m_buf, that.m_buf, that.m_cap * sizeof(NodeData));
    m_cap = that.m_cap;
    m_size = that.m_size;
    m_free_head = that.m_free_head;
    m_free_tail = that.m_free_tail;
    m_arena_pos = that.m_arena_pos;
    m_arena = that.m_arena;
    if(that.m_arena.str)
    {
        _RYML_CB_ASSERT(m_callbacks, that.m_arena.len > 0);
        substr arena;
        arena.str = _RYML_CB_ALLOC_HINT(m_callbacks, char, that.m_arena.len, that.m_arena.str);
        arena.len = that.m_arena.len;
        _relocate(arena); // does a memcpy of the arena and updates nodes using the old arena
        m_arena = arena;
    }
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        m_tag_directives[i] = that.m_tag_directives[i];
}